

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

void Gia_ManSuperCollectAnd_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Vec_Int_t *p_00;
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pObj);
  if ((((iVar1 == 0) && (iVar1 = Gia_ObjIsAndReal(p,pObj), iVar1 != 0)) &&
      (iVar1 = Gia_ObjRefNum(p,pObj), iVar1 < 2)) && (iVar1 = Vec_IntSize(p->vSuper), iVar1 < 0x65))
  {
    pGVar2 = Gia_ObjChild0(pObj);
    Gia_ManSuperCollectAnd_rec(p,pGVar2);
    pGVar2 = Gia_ObjChild1(pObj);
    Gia_ManSuperCollectAnd_rec(p,pGVar2);
    return;
  }
  p_00 = p->vSuper;
  iVar1 = Gia_ObjToLit(p,pObj);
  Vec_IntPush(p_00,iVar1);
  return;
}

Assistant:

static inline void Gia_ManSuperCollectAnd_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_IsComplement(pObj) || 
        !Gia_ObjIsAndReal(p, pObj) || 
        Gia_ObjRefNum(p, pObj) > 1 || 
//        Gia_ObjRefNum(p, pObj) > 3 || 
//        (Gia_ObjRefNum(p, pObj) == 2 && (Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) == 1 || Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) == 1)) || 
        Vec_IntSize(p->vSuper) > STR_SUPER )
    {
        Vec_IntPush( p->vSuper, Gia_ObjToLit(p, pObj) );
        return;
    }
    Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild0(pObj) );
    Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild1(pObj) );
}